

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParserTest_popTest_Test::TestBody(OpenDDLParserTest_popTest_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  DDLNode *pDVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  DDLNode *current;
  DDLNode *node3;
  DDLNode *node2;
  DDLNode *node1;
  OpenDDLParser theParser;
  AssertHelper local_e0;
  string local_d8;
  string local_b8;
  DDLNode *local_98;
  DDLNode *local_90;
  DDLNode *local_88;
  DDLNode *local_80;
  OpenDDLParser local_78;
  
  OpenDDLParser::OpenDDLParser(&local_78);
  local_d8._M_dataplus._M_p = (pointer)OpenDDLParser::top(&local_78);
  local_e0.data_ = (AssertHelperData *)0x0;
  local_98 = (DDLNode *)local_d8._M_dataplus._M_p;
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&local_b8,"nullptr","current",(DDLNode **)&local_e0,(DDLNode **)&local_d8);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x306,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((DDLNode *)local_d8._M_dataplus._M_p != (DDLNode *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((DDLNode *)local_d8._M_dataplus._M_p != (DDLNode *)0x0)) {
        (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"test1","");
  paVar2 = &local_d8.field_2;
  pcVar5 = "";
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"","");
  pDVar4 = DDLNode::create(&local_b8,&local_d8,(DDLNode *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_80 = pDVar4;
  OpenDDLParser::pushNode(&local_78,pDVar4);
  local_98 = OpenDDLParser::top(&local_78);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&local_b8,"node1","current",&local_80,&local_98);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
      pcVar5 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x30b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"test2","");
  pcVar5 = "";
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"","");
  pDVar4 = DDLNode::create(&local_b8,&local_d8,(DDLNode *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_88 = pDVar4;
  OpenDDLParser::pushNode(&local_78,pDVar4);
  local_98 = OpenDDLParser::top(&local_78);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&local_b8,"node2","current",&local_88,&local_98);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
      pcVar5 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x310,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"test3","");
  pcVar5 = "";
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"","");
  pDVar4 = DDLNode::create(&local_b8,&local_d8,(DDLNode *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_90 = pDVar4;
  OpenDDLParser::pushNode(&local_78,pDVar4);
  local_98 = OpenDDLParser::top(&local_78);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&local_b8,"node3","current",&local_90,&local_98);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_b8._M_string_length != (undefined8 *)0x0) {
      pcVar5 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x315,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98 = OpenDDLParser::popNode(&local_78);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&local_b8,"node3","current",&local_90,&local_98);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x318,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98 = OpenDDLParser::popNode(&local_78);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&local_b8,"node2","current",&local_88,&local_98);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x31a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98 = OpenDDLParser::popNode(&local_78);
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&local_b8,"node1","current",&local_80,&local_98);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,0x31c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_d8._M_dataplus._M_p + 8))();
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_d8._M_dataplus._M_p = (pointer)OpenDDLParser::top(&local_78);
  local_e0.data_ = (AssertHelperData *)0x0;
  local_98 = (DDLNode *)local_d8._M_dataplus._M_p;
  testing::internal::CmpHelperEQ<ODDLParser::DDLNode*,ODDLParser::DDLNode*>
            ((internal *)&local_b8,"nullptr","current",(DDLNode **)&local_e0,(DDLNode **)&local_d8);
  if ((char)local_b8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if ((undefined8 *)local_b8._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_b8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLParserTest.cpp"
               ,799,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((DDLNode *)local_d8._M_dataplus._M_p != (DDLNode *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((DDLNode *)local_d8._M_dataplus._M_p != (DDLNode *)0x0)) {
        (**(code **)(*(long *)local_d8._M_dataplus._M_p + 8))();
      }
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pDVar4 = local_80;
  if (local_80 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(local_80);
    operator_delete(pDVar4,0x88);
  }
  pDVar4 = local_88;
  if (local_88 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(local_88);
    operator_delete(pDVar4,0x88);
  }
  pDVar4 = local_90;
  if (local_90 != (DDLNode *)0x0) {
    DDLNode::~DDLNode(local_90);
    operator_delete(pDVar4,0x88);
  }
  OpenDDLParser::~OpenDDLParser(&local_78);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, popTest) {
    OpenDDLParser theParser;

    DDLNode *current = theParser.top();
    EXPECT_EQ(nullptr, current);

    DDLNode *node1 = DDLNode::create("test1", "", nullptr);
    theParser.pushNode(node1);
    current = theParser.top();
    EXPECT_EQ(node1, current);

    DDLNode *node2 = DDLNode::create("test2", "", nullptr);
    theParser.pushNode(node2);
    current = theParser.top();
    EXPECT_EQ(node2, current);

    DDLNode *node3 = DDLNode::create("test3", "", nullptr);
    theParser.pushNode(node3);
    current = theParser.top();
    EXPECT_EQ(node3, current);

    current = theParser.popNode();
    EXPECT_EQ(node3, current);
    current = theParser.popNode();
    EXPECT_EQ(node2, current);
    current = theParser.popNode();
    EXPECT_EQ(node1, current);

    current = theParser.top();
    EXPECT_EQ(nullptr, current);
    delete node1;
    delete node2;
    delete node3;
}